

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_modelWithComponentVariableUnits_Test::TestBody
          (Clone_modelWithComponentVariableUnits_Test *this)

{
  char *pcVar1;
  shared_ptr<libcellml::Units> *in_R9;
  shared_ptr<libcellml::Units> local_e8;
  AssertionResult gtest_ar_3;
  shared_ptr<libcellml::Units> local_c8;
  shared_ptr<libcellml::Units> local_b8;
  ModelPtr clonedModel;
  shared_ptr<libcellml::Units> local_88;
  ModelPtr model;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ComponentPtr component;
  UnitsPtr units;
  VariablePtr v2;
  VariablePtr v1;
  undefined1 local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clonedModel,"model",(allocator<char> *)&units);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&clonedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clonedModel,"units",(allocator<char> *)&component);
  libcellml::Units::create((string *)&units);
  std::__cxx11::string::~string((string *)&clonedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clonedModel,"component",(allocator<char> *)&v1);
  libcellml::Component::create((string *)&component);
  std::__cxx11::string::~string((string *)&clonedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clonedModel,"v1",(allocator<char> *)&v2);
  libcellml::Variable::create((string *)&v1);
  std::__cxx11::string::~string((string *)&clonedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clonedModel,"v2",(allocator<char> *)&gtest_ar_3);
  libcellml::Variable::create((string *)&v2);
  std::__cxx11::string::~string((string *)&clonedModel);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::component((ulong)&local_c8);
  libcellml::Component::variable((ulong)&local_e8);
  libcellml::Variable::units();
  libcellml::ComponentEntity::component((ulong)local_68);
  libcellml::Component::variable((ulong)&local_88);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)&clonedModel,(internal *)"model->component(0)->variable(0)->units()"
             ,"model->component(0)->variable(1)->units()",&gtest_ar_3.success_,&local_b8,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if ((char)clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)clonedModel.
                         super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x210,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Model::units((ulong)&gtest_ar_3);
  libcellml::ComponentEntity::component((ulong)&local_b8);
  libcellml::Component::variable((ulong)&local_c8);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)&clonedModel,(internal *)"model->units(0)",
             "model->component(0)->variable(0)->units()",&gtest_ar_3.success_,&local_e8,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
  if ((char)clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)clonedModel.
                         super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x211,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Model::units((ulong)&gtest_ar_3);
  libcellml::ComponentEntity::component((ulong)&local_b8);
  libcellml::Component::variable((ulong)&local_c8);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)&clonedModel,(internal *)"model->units(0)",
             "model->component(0)->variable(1)->units()",&gtest_ar_3.success_,&local_e8,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
  if ((char)clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)clonedModel.
                         super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x212,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Model::clone();
  libcellml::ComponentEntity::component((ulong)&local_b8);
  libcellml::Component::variable((ulong)&local_c8);
  libcellml::Variable::units();
  libcellml::ComponentEntity::component((ulong)local_18);
  libcellml::Component::variable((ulong)local_68);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            (&gtest_ar_3,(internal *)"clonedModel->component(0)->variable(0)->units()",
             "clonedModel->component(0)->variable(1)->units()",(char *)&local_e8,&local_88,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar_3._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x216,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  libcellml::Model::units((ulong)&local_e8);
  libcellml::ComponentEntity::component((ulong)&local_88);
  libcellml::Component::variable((ulong)&local_b8);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            (&gtest_ar_3,(internal *)"clonedModel->units(0)",
             "clonedModel->component(0)->variable(0)->units()",(char *)&local_e8,&local_c8,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar_3._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x217,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  libcellml::Model::units((ulong)&local_e8);
  libcellml::ComponentEntity::component((ulong)&local_88);
  libcellml::Component::variable((ulong)&local_b8);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            (&gtest_ar_3,(internal *)"clonedModel->units(0)",
             "clonedModel->component(0)->variable(1)->units()",(char *)&local_e8,&local_c8,in_R9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar_3._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x218,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Clone, modelWithComponentVariableUnits)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");
    auto component = libcellml::Component::create("component");
    auto v1 = libcellml::Variable::create("v1");
    auto v2 = libcellml::Variable::create("v2");

    model->addComponent(component);
    model->addUnits(units);
    component->addVariable(v1);
    component->addVariable(v2);
    v1->setUnits(units);
    v2->setUnits(units);

    EXPECT_EQ(model->component(0)->variable(0)->units(), model->component(0)->variable(1)->units());
    EXPECT_EQ(model->units(0), model->component(0)->variable(0)->units());
    EXPECT_EQ(model->units(0), model->component(0)->variable(1)->units());

    auto clonedModel = model->clone();

    EXPECT_EQ(clonedModel->component(0)->variable(0)->units(), clonedModel->component(0)->variable(1)->units());
    EXPECT_EQ(clonedModel->units(0), clonedModel->component(0)->variable(0)->units());
    EXPECT_EQ(clonedModel->units(0), clonedModel->component(0)->variable(1)->units());
}